

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::FeedbackPrimitiveTypeCase::
getTessellationEvaluationSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  RenderContext *pRVar2;
  char *pcVar3;
  char *local_1f8;
  ContextType local_1c4;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream buf;
  FeedbackPrimitiveTypeCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,
                           "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(");
  if (*(int *)((long)this + 0x78) == 0) {
    local_1f8 = "triangles";
  }
  else {
    local_1f8 = "isolines";
    if (*(int *)((long)this + 0x78) == 1) {
      local_1f8 = "quads";
    }
  }
  poVar1 = std::operator<<(poVar1,local_1f8);
  pcVar3 = "";
  if (*(int *)((long)this + 0x7c) != 0) {
    pcVar3 = ", point_mode";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::operator<<(poVar1,
                  ") in;\n\nout highp vec4 v_tessellationCoords;\n\n// note: No need to use precise gl_Position since we do not require gapless geometry\nvoid main (void)\n{\n\tif (gl_PatchVerticesIn != 9)\n\t\treturn;\n\n\tvec4 patchCentroid = vec4(0.0);\n\tfor (int ndx = 0; ndx < gl_PatchVerticesIn; ++ndx)\n\t\tpatchCentroid += gl_in[ndx].gl_Position;\n\tpatchCentroid /= patchCentroid.w;\n\n"
                 );
  if (*(int *)((long)this + 0x78) == 0) {
    std::operator<<((ostream *)local_190,
                    "\t// map barycentric coords to 2d coords\n\tconst vec3 tessDirX = vec3( 0.4,  0.4, 0.0);\n\tconst vec3 tessDirY = vec3( 0.0, -0.4, 0.0);\n\tconst vec3 tessDirZ = vec3(-0.4,  0.4, 0.0);\n\tgl_Position = patchCentroid + vec4(gl_TessCoord.x * tessDirX + gl_TessCoord.y * tessDirY + gl_TessCoord.z * tessDirZ, 0.0);\n"
                   );
  }
  else if ((*(int *)((long)this + 0x78) == 1) || (*(int *)((long)this + 0x78) == 2)) {
    std::operator<<((ostream *)local_190,
                    "\tgl_Position = patchCentroid + vec4(gl_TessCoord.x * 0.8 - 0.4, gl_TessCoord.y * 0.8 - 0.4, 0.0, 0.0);\n"
                   );
  }
  std::operator<<((ostream *)local_190,"\tv_tessellationCoords = vec4(gl_TessCoord, 0.0);\n}\n");
  std::__cxx11::ostringstream::str();
  pRVar2 = Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1c4.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_1c0,&local_1c4);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string FeedbackPrimitiveTypeCase::getTessellationEvaluationSource (void) const
{
	std::ostringstream buf;

	buf <<	"${VERSION_DECL}\n"
			"${EXTENSION_TESSELATION_SHADER}"
			"layout("
				<< ((m_tessellationOutput == TESSELLATION_OUT_TRIANGLES) ? ("triangles") : (m_tessellationOutput == TESSELLATION_OUT_QUADS) ? ("quads") : ("isolines"))
				<< ((m_tessellationPointMode) ? (", point_mode") : (""))
				<< ") in;\n"
			"\n"
			"out highp vec4 v_tessellationCoords;\n"
			"\n"
			"// note: No need to use precise gl_Position since we do not require gapless geometry\n"
			"void main (void)\n"
			"{\n"
			"	if (gl_PatchVerticesIn != 9)\n"
			"		return;\n"
			"\n"
			"	vec4 patchCentroid = vec4(0.0);\n"
			"	for (int ndx = 0; ndx < gl_PatchVerticesIn; ++ndx)\n"
			"		patchCentroid += gl_in[ndx].gl_Position;\n"
			"	patchCentroid /= patchCentroid.w;\n"
			"\n";

	if (m_tessellationOutput == TESSELLATION_OUT_TRIANGLES)
		buf <<	"	// map barycentric coords to 2d coords\n"
				"	const vec3 tessDirX = vec3( 0.4,  0.4, 0.0);\n"
				"	const vec3 tessDirY = vec3( 0.0, -0.4, 0.0);\n"
				"	const vec3 tessDirZ = vec3(-0.4,  0.4, 0.0);\n"
				"	gl_Position = patchCentroid + vec4(gl_TessCoord.x * tessDirX + gl_TessCoord.y * tessDirY + gl_TessCoord.z * tessDirZ, 0.0);\n";
	else if (m_tessellationOutput == TESSELLATION_OUT_QUADS || m_tessellationOutput == TESSELLATION_OUT_ISOLINES)
		buf <<	"	gl_Position = patchCentroid + vec4(gl_TessCoord.x * 0.8 - 0.4, gl_TessCoord.y * 0.8 - 0.4, 0.0, 0.0);\n";
	else
		DE_ASSERT(false);

	buf <<	"	v_tessellationCoords = vec4(gl_TessCoord, 0.0);\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}